

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O0

unsigned_long elf_hash(char *s)

{
  ulong uVar1;
  unsigned_long high;
  unsigned_long h;
  char *s_local;
  
  high = 0;
  h = (unsigned_long)s;
  while (*(char *)h != '\0') {
    high = high * 0x10 + (ulong)*(byte *)h;
    uVar1 = high & 0xf0000000;
    if (uVar1 != 0) {
      high = uVar1 >> 0x18 ^ high;
    }
    high = (uVar1 ^ 0xffffffffffffffff) & high;
    h = h + 1;
  }
  return high;
}

Assistant:

static unsigned long elf_hash (const char *s)
{
    unsigned long h = 0, high;
    while (*s) {
        h = (h << 4) + (unsigned char) *s++;
        if ((high = h & 0xf0000000))
            h ^= high >> 24;
        h &= ~high;
    }
    return h;
}